

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZShapeHDiv.cpp
# Opt level: O3

void TPZShapeHDiv<pzshape::TPZShapePiram>::Initialize
               (TPZVec<long> *ids,TPZVec<int> *connectorders,TPZVec<int> *sideorient,
               TPZShapeData *data)

{
  ulong uVar1;
  long *plVar2;
  int *piVar3;
  int *piVar4;
  long lVar5;
  ulong uVar6;
  int iVar7;
  undefined1 auVar8 [16];
  undefined1 auVar10 [16];
  TPZManVector<int,_27> scalarOrders;
  undefined8 uStack_160;
  undefined8 local_158;
  TPZManVector<int,_20> local_150;
  TPZManVector<int,_27> local_c0;
  long lVar9;
  
  piVar4 = local_150.fExtAlloc;
  local_150.super_TPZVec<int>.fStore = (int *)0x0;
  local_150.super_TPZVec<int>.fNElements = 0;
  local_150.super_TPZVec<int>.fNAlloc = 0;
  local_150.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_018b7200;
  uVar1 = ids->fNElements;
  local_158 = connectorders;
  if ((long)uVar1 < 9) {
    local_150.super_TPZVec<int>.fStore = local_150.fExtAlloc;
    if (0 < (long)uVar1) goto LAB_0100bd91;
  }
  else {
    uStack_160 = (undefined *)0x100bd82;
    local_150.super_TPZVec<int>.fStore =
         (int *)operator_new__(-(ulong)(uVar1 >> 0x3d != 0) | uVar1 * 8);
    local_150.super_TPZVec<int>.fNAlloc = uVar1;
LAB_0100bd91:
    plVar2 = ids->fStore;
    uVar6 = 0;
    do {
      *(long *)(local_150.super_TPZVec<int>.fStore + uVar6 * 2) = plVar2[uVar6];
      uVar6 = uVar6 + 1;
    } while (uVar1 != uVar6);
  }
  uStack_160 = (undefined *)0x100bdbb;
  local_150.super_TPZVec<int>.fNElements = uVar1;
  TPZManVector<long,_8>::operator=(&data->fCornerNodeIds,(TPZManVector<long,_8> *)&local_150);
  if (local_150.super_TPZVec<int>.fStore != piVar4) {
    local_150.super_TPZVec<int>.fNAlloc = 0;
    local_150.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813f30;
    if (local_150.super_TPZVec<int>.fStore != (int *)0x0) {
      uStack_160 = (undefined *)0x100bde7;
      operator_delete__(local_150.super_TPZVec<int>.fStore);
    }
  }
  local_150.super_TPZVec<int>.fStore = (int *)0x0;
  local_150.super_TPZVec<int>.fNElements = 0;
  local_150.super_TPZVec<int>.fNAlloc = 0;
  local_150.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_018237a0;
  uVar1 = sideorient->fNElements;
  if ((long)uVar1 < 0x15) {
    local_150.super_TPZVec<int>.fStore = piVar4;
    if ((long)uVar1 < 1) goto LAB_0100be6a;
  }
  else {
    uStack_160 = (undefined *)0x100be46;
    local_150.super_TPZVec<int>.fStore =
         (int *)operator_new__(-(ulong)(uVar1 >> 0x3e != 0) | uVar1 * 4);
    local_150.super_TPZVec<int>.fNAlloc = uVar1;
  }
  piVar3 = sideorient->fStore;
  uVar6 = 0;
  do {
    local_150.super_TPZVec<int>.fStore[uVar6] = piVar3[uVar6];
    uVar6 = uVar6 + 1;
  } while (uVar1 != uVar6);
LAB_0100be6a:
  uStack_160 = (undefined *)0x100be7e;
  local_150.super_TPZVec<int>.fNElements = uVar1;
  TPZManVector<int,_20>::operator=(&data->fSideOrient,&local_150);
  if (local_150.super_TPZVec<int>.fStore != piVar4) {
    local_150.super_TPZVec<int>.fNAlloc = 0;
    local_150.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813ef0;
    if (local_150.super_TPZVec<int>.fStore != (int *)0x0) {
      uStack_160 = (undefined *)0x100beab;
      operator_delete__(local_150.super_TPZVec<int>.fStore);
    }
  }
  iVar7 = local_158->fStore[5] + 1;
  uStack_160 = (undefined *)0x100bec9;
  TPZVec<int>::TPZVec(&local_150.super_TPZVec<int>,0);
  local_150.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_018896a0;
  local_150.super_TPZVec<int>.fNElements = 0xe;
  local_150.super_TPZVec<int>.fNAlloc = 0;
  lVar5 = 0xb;
  auVar8 = _DAT_014d2b10;
  auVar10 = _DAT_014d28b0;
  do {
    if (SUB164(auVar10 ^ _DAT_014d28c0,4) == -0x80000000 &&
        SUB164(auVar10 ^ _DAT_014d28c0,0) < -0x7ffffff2) {
      *(int *)((long)&uStack_160 + lVar5 * 4 + 4) = iVar7;
      *(int *)((long)&local_158 + lVar5 * 4) = iVar7;
    }
    if (SUB164(auVar8 ^ _DAT_014d28c0,4) == -0x80000000 &&
        SUB164(auVar8 ^ _DAT_014d28c0,0) < -0x7ffffff2) {
      *(int *)((long)&local_158 + lVar5 * 4 + 4) = iVar7;
      local_150.fExtAlloc[lVar5 + -8] = iVar7;
    }
    lVar9 = auVar10._8_8_;
    auVar10._0_8_ = auVar10._0_8_ + 4;
    auVar10._8_8_ = lVar9 + 4;
    lVar9 = auVar8._8_8_;
    auVar8._0_8_ = auVar8._0_8_ + 4;
    auVar8._8_8_ = lVar9 + 4;
    lVar5 = lVar5 + 4;
  } while (lVar5 != 0x1b);
  uStack_160 = (undefined *)0x100bfbb;
  local_150.super_TPZVec<int>.fStore = piVar4;
  TPZShapeH1<pzshape::TPZShapePiram>::Initialize
            (&(data->fCornerNodeIds).super_TPZVec<long>,&local_150.super_TPZVec<int>,data);
  if (local_158->fNElements == 6) {
    local_c0.super_TPZVec<int>.fStore = local_c0.fExtAlloc;
    local_c0.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_018896a0;
    local_c0.super_TPZVec<int>.fNElements = 6;
    local_c0.super_TPZVec<int>.fNAlloc = 0;
    piVar4 = local_158->fStore;
    lVar5 = 0;
    do {
      local_c0.super_TPZVec<int>.fStore[lVar5] = piVar4[lVar5];
      lVar5 = lVar5 + 1;
    } while (lVar5 != 6);
    uStack_160 = (undefined *)0x100c01d;
    TPZManVector<int,_27>::operator=(&data->fHDivConnectOrders,&local_c0);
    if (local_c0.super_TPZVec<int>.fStore == local_c0.fExtAlloc) {
      local_c0.super_TPZVec<int>.fStore = (int *)0x0;
    }
    else {
      local_c0.super_TPZVec<int>.fNAlloc = 0;
      local_c0.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813ef0;
      if (local_c0.super_TPZVec<int>.fStore != (int *)0x0) {
        uStack_160 = (undefined *)0x100c0c6;
        operator_delete__(local_c0.super_TPZVec<int>.fStore);
      }
    }
    uStack_160 = (undefined *)0x100c0da;
    TPZManVector<int,_27>::Resize(&data->fHDivNumConnectShape,6);
    uStack_160 = &UNK_0100c0eb;
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Shape/TPZShapeHDiv.cpp"
               ,0x1c5);
  }
  uStack_160 = &UNK_0100c050;
  pzinternal::DebugStopImpl
            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Shape/TPZShapeHDiv.cpp"
             ,0x26);
}

Assistant:

void TPZShapeHDiv<TSHAPE>::Initialize(const TPZVec<int64_t> &ids,
                                      const TPZVec<int> &connectorders,
                                      const TPZVec<int>& sideorient,
                                      TPZShapeData &data)
{
    
        
    data.fCornerNodeIds = ids;
    data.fSideOrient = sideorient;
    const int ncon = TSHAPE::NFacets+1;
    //data.fHDivConnectOrders = connectorders;TODOPHIL
    int scalarorder = connectorders[TSHAPE::NFacets]+1;
    TPZManVector<int,27> scalarOrders(TSHAPE::NSides-TSHAPE::NCornerNodes,scalarorder);
    

    TPZShapeH1<TSHAPE>::Initialize(data.fCornerNodeIds, scalarOrders, data);
    if(connectorders.size() != TSHAPE::NFacets+1) DebugStop();
    
    data.fHDivConnectOrders = connectorders;

    data.fHDivNumConnectShape.Resize(TSHAPE::NFacets+1);
    int nShape = 0;
    for (int i = 0; i < TSHAPE::NFacets+1; i++)
    {
        int order = data.fHDivConnectOrders[i];
        data.fHDivNumConnectShape[i] = ComputeNConnectShapeF(i,order);
        nShape += data.fHDivNumConnectShape[i];
    }
    
    data.fSDVecShapeIndex.Resize(nShape);

    ComputeMasterDirections(data);
    ComputeVecandShape(data);
    
    //Checks if the last connect order is >= then the other connects
    int size = data.fHDivConnectOrders.size();
    int maxOrder = data.fHDivConnectOrders[size-1];
    for (int i = 0; i < size-1; i++)
    {
        if (data.fHDivConnectOrders[i] > maxOrder){
            DebugStop();
        }
    }    
}